

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::LRN_x86_avx512::forward_inplace(LRN_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  size_t _elemsize;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  byte bVar13;
  byte bVar14;
  int *piVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  pointer piVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  _func_int ***ppp_Var22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  float *pfVar26;
  _func_int ***ppp_Var27;
  uint uVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  long lVar33;
  LRN_x86_avx512 *pLVar34;
  uint uVar35;
  void *pvVar36;
  long lVar37;
  undefined1 (*pauVar38) [32];
  ushort uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  allocator_type local_219;
  undefined8 local_218;
  LRN_x86_avx512 *local_210;
  undefined1 local_208 [12];
  float fStack_1fc;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  int local_1f0;
  Allocator *local_1e8;
  int iStack_1e0;
  float fStack_1dc;
  int iStack_1d8;
  int iStack_1d4;
  int iStack_1d0;
  size_t local_1c8;
  ulong local_1c0;
  Mat *local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [16];
  size_t local_198;
  int local_190;
  Allocator *local_188;
  int iStack_180;
  float fStack_17c;
  size_t sStack_178;
  int local_170;
  size_t local_168;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  long local_130;
  Allocator *local_128;
  long local_120;
  void *local_118;
  long local_110;
  _func_int ***local_108;
  long local_100;
  undefined1 local_f8 [32];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [64];
  vector<int,_std::allocator<int>_> _space_ofs;
  undefined1 auVar57 [32];
  undefined1 auVar62 [32];
  
  local_158 = (float)bottom_top_blob->w;
  local_218 = (ulong)(uint)bottom_top_blob->h;
  uVar35 = bottom_top_blob->c;
  uVar23 = (ulong)uVar35;
  _elemsize = bottom_top_blob->elemsize;
  local_168 = 0;
  local_1a8._0_8_ = (Allocator *)0x0;
  local_1a8._8_4_ = 0;
  local_1a8._12_4_ = 0.0;
  local_198 = SUB168(ZEXT816(0) << 0x40,4);
  local_190 = 0;
  fStack_154 = 0.0;
  local_210 = this;
  local_188 = (Allocator *)local_1a8._0_8_;
  iStack_180 = local_1a8._8_4_;
  fStack_17c = (float)local_1a8._12_4_;
  sStack_178 = local_198;
  local_170 = local_190;
  Mat::create((Mat *)local_1a8,(int)local_158,bottom_top_blob->h,uVar35,_elemsize,
              opt->workspace_allocator);
  iVar30 = -100;
  if (((Allocator *)local_1a8._0_8_ == (Allocator *)0x0) || ((long)local_170 * local_168 == 0))
  goto LAB_003163aa;
  uVar28 = (int)local_218 * (int)local_158;
  if (0 < (int)uVar35) {
    uVar21 = 0;
    do {
      pfVar26 = (float *)(bottom_top_blob->cstep * uVar21 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      ppp_Var22 = (_func_int ***)
                  ((long)(_func_int ***)local_1a8._0_8_ + local_168 * uVar21 * local_198);
      if ((int)uVar28 < 8) {
        uVar24 = 0;
      }
      else {
        iVar30 = 7;
        do {
          auVar63._4_4_ = pfVar26[1] * pfVar26[1];
          auVar63._0_4_ = *pfVar26 * *pfVar26;
          auVar63._8_4_ = pfVar26[2] * pfVar26[2];
          auVar63._12_4_ = pfVar26[3] * pfVar26[3];
          auVar63._16_4_ = pfVar26[4] * pfVar26[4];
          auVar63._20_4_ = pfVar26[5] * pfVar26[5];
          auVar63._24_4_ = pfVar26[6] * pfVar26[6];
          auVar63._28_4_ = pfVar26[7];
          *(undefined1 (*) [32])ppp_Var22 = auVar63;
          pfVar26 = pfVar26 + 8;
          ppp_Var22 = ppp_Var22 + 4;
          iVar30 = iVar30 + 8;
          uVar24 = uVar28 & 0xfffffff8;
        } while (iVar30 < (int)uVar28);
      }
      if (uVar28 - uVar24 != 0 && (int)uVar24 <= (int)uVar28) {
        lVar33 = 0;
        do {
          *(float *)((long)ppp_Var22 + lVar33 * 4) = pfVar26[lVar33] * pfVar26[lVar33];
          lVar33 = lVar33 + 1;
        } while (uVar28 - uVar24 != (int)lVar33);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar23);
  }
  iVar19 = (local_210->super_LRN).region_type;
  iVar30 = 0;
  local_1b0 = uVar23;
  if (iVar19 == 0) {
    local_1c8 = 0;
    local_208._0_8_ = (Allocator *)0x0;
    local_208._8_4_ = 0;
    fStack_1fc = 0.0;
    local_1f8 = 0;
    uStack_1f4 = 0;
    local_1f0 = 0;
    local_1e8 = (Allocator *)0x0;
    iStack_1e0 = 0;
    fStack_1dc = 0.0;
    iStack_1d8 = 0;
    iStack_1d4 = 0;
    iStack_1d0 = 0;
    Mat::create((Mat *)local_208,(int)local_158,(int)local_218,uVar35,_elemsize,
                opt->workspace_allocator);
    if (((Allocator *)local_208._0_8_ == (Allocator *)0x0) || (local_1c8 * (long)iStack_1d0 == 0)) {
      piVar15 = (int *)CONCAT44(fStack_1fc,local_208._8_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_1e8 == (Allocator *)0x0) {
joined_r0x00316382:
            if ((Allocator *)local_208._0_8_ != (Allocator *)0x0) {
              free((void *)local_208._0_8_);
            }
          }
          else {
            (*local_1e8->_vptr_Allocator[3])();
          }
        }
      }
LAB_003163a5:
      iVar30 = -100;
      goto LAB_003163aa;
    }
    uVar24 = (int)local_1c8 * iStack_1d0;
    local_1b8 = bottom_top_blob;
    if (0 < (int)uVar24) {
      memset((void *)local_208._0_8_,0,(ulong)uVar24 << 2);
    }
    if (0 < (int)uVar35) {
      auVar77 = ZEXT416((uint)((local_210->super_LRN).alpha /
                              (float)(local_210->super_LRN).local_size));
      auVar64 = ZEXT1664(auVar77);
      local_f8 = vbroadcastss_avx512vl(auVar77);
      uVar21 = 0;
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      local_218 = CONCAT44(local_218._4_4_,uVar28) & 0xfffffffffffffff8;
      local_b8._0_16_ = auVar77;
      pLVar34 = local_210;
      uVar35 = uVar28 & 0xfffffff8;
      do {
        auVar78._8_4_ = 0xbe7ffffc;
        auVar78._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar59._8_4_ = 0xffffff82;
        auVar59._0_8_ = 0xffffff82ffffff82;
        auVar58._8_4_ = 0x807fffff;
        auVar58._0_8_ = 0x807fffff807fffff;
        auVar55._8_4_ = 0x3f000000;
        auVar55._0_8_ = 0x3f0000003f000000;
        auVar75._8_4_ = 0x800000;
        auVar75._0_8_ = 0x80000000800000;
        auVar71._8_4_ = 0x3f800000;
        auVar71._0_8_ = 0x3f8000003f800000;
        auVar78._12_4_ = 0xbe7ffffc;
        auVar59._12_4_ = 0xffffff82;
        auVar58._12_4_ = 0x807fffff;
        auVar55._12_4_ = 0x3f000000;
        auVar75._12_4_ = 0x800000;
        auVar71._12_4_ = 0x3f800000;
        auVar78._16_4_ = 0xbe7ffffc;
        auVar59._16_4_ = 0xffffff82;
        auVar58._16_4_ = 0x807fffff;
        auVar55._16_4_ = 0x3f000000;
        auVar75._16_4_ = 0x800000;
        auVar71._16_4_ = 0x3f800000;
        auVar78._20_4_ = 0xbe7ffffc;
        auVar59._20_4_ = 0xffffff82;
        auVar58._20_4_ = 0x807fffff;
        auVar55._20_4_ = 0x3f000000;
        auVar75._20_4_ = 0x800000;
        auVar71._20_4_ = 0x3f800000;
        auVar78._24_4_ = 0xbe7ffffc;
        auVar59._24_4_ = 0xffffff82;
        auVar58._24_4_ = 0x807fffff;
        auVar55._24_4_ = 0x3f000000;
        auVar75._24_4_ = 0x800000;
        auVar71._24_4_ = 0x3f800000;
        auVar78._28_4_ = 0xbe7ffffc;
        auVar59._28_4_ = 0xffffff82;
        auVar58._28_4_ = 0x807fffff;
        auVar55._28_4_ = 0x3f000000;
        auVar75._28_4_ = 0x800000;
        auVar71._28_4_ = 0x3f800000;
        iVar30 = (pLVar34->super_LRN).local_size / 2;
        iVar19 = (int)uVar21;
        uVar24 = iVar19 - iVar30;
        if ((int)uVar24 <= iVar30 + iVar19) {
          do {
            if (uVar24 < (uint)uVar23) {
              ppp_Var22 = (_func_int ***)
                          ((long)(_func_int ***)local_1a8._0_8_ + uVar24 * local_168 * local_198);
              ppp_Var27 = (_func_int ***)
                          ((long)(_func_int ***)local_208._0_8_ +
                          local_1c8 * uVar21 * CONCAT44(uStack_1f4,local_1f8));
              uVar31 = 0;
              if (7 < (int)uVar28) {
                iVar30 = 7;
                do {
                  auVar48._0_4_ = *(float *)ppp_Var27 + *(float *)ppp_Var22;
                  auVar48._4_4_ = *(float *)((long)ppp_Var27 + 4) + *(float *)((long)ppp_Var22 + 4);
                  auVar48._8_4_ = *(float *)(ppp_Var27 + 1) + *(float *)(ppp_Var22 + 1);
                  auVar48._12_4_ =
                       *(float *)((long)(ppp_Var27 + 1) + 4) + *(float *)((long)(ppp_Var22 + 1) + 4)
                  ;
                  auVar48._16_4_ = *(float *)(ppp_Var27 + 2) + *(float *)(ppp_Var22 + 2);
                  auVar48._20_4_ =
                       *(float *)((long)(ppp_Var27 + 2) + 4) + *(float *)((long)(ppp_Var22 + 2) + 4)
                  ;
                  auVar48._24_4_ = *(float *)(ppp_Var27 + 3) + *(float *)(ppp_Var22 + 3);
                  auVar48._28_4_ =
                       *(float *)((long)(ppp_Var27 + 3) + 4) + *(float *)((long)(ppp_Var22 + 3) + 4)
                  ;
                  *(undefined1 (*) [32])ppp_Var27 = auVar48;
                  ppp_Var22 = ppp_Var22 + 4;
                  ppp_Var27 = ppp_Var27 + 4;
                  iVar30 = iVar30 + 8;
                  uVar31 = uVar35;
                } while (iVar30 < (int)uVar28);
              }
              if (uVar28 - uVar31 != 0 && (int)uVar31 <= (int)uVar28) {
                lVar33 = 0;
                do {
                  *(float *)((long)ppp_Var27 + lVar33 * 4) =
                       *(float *)((long)ppp_Var27 + lVar33 * 4) +
                       *(float *)((long)ppp_Var22 + lVar33 * 4);
                  lVar33 = lVar33 + 1;
                } while (uVar28 - uVar31 != (int)lVar33);
              }
            }
            bVar8 = (int)uVar24 < (pLVar34->super_LRN).local_size / 2 + iVar19;
            uVar24 = uVar24 + 1;
          } while (bVar8);
        }
        pauVar38 = (undefined1 (*) [32])
                   (local_1b8->cstep * uVar21 * local_1b8->elemsize + (long)local_1b8->data);
        ppp_Var22 = (_func_int ***)
                    ((long)(_func_int ***)local_208._0_8_ +
                    local_1c8 * uVar21 * CONCAT44(uStack_1f4,local_1f8));
        uVar24 = 0;
        if (7 < (int)uVar28) {
          local_158 = (pLVar34->super_LRN).bias;
          local_d8 = -(pLVar34->super_LRN).beta;
          iVar30 = 7;
          auVar48 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar79._8_4_ = 0xc2b0c0a5;
          auVar79._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar79._12_4_ = 0xc2b0c0a5;
          auVar79._16_4_ = 0xc2b0c0a5;
          auVar79._20_4_ = 0xc2b0c0a5;
          auVar79._24_4_ = 0xc2b0c0a5;
          auVar79._28_4_ = 0xc2b0c0a5;
          auVar80._8_4_ = 0x3fb8aa3b;
          auVar80._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar80._12_4_ = 0x3fb8aa3b;
          auVar80._16_4_ = 0x3fb8aa3b;
          auVar80._20_4_ = 0x3fb8aa3b;
          auVar80._24_4_ = 0x3fb8aa3b;
          auVar80._28_4_ = 0x3fb8aa3b;
          auVar81._8_4_ = 0x39506967;
          auVar81._0_8_ = 0x3950696739506967;
          auVar81._12_4_ = 0x39506967;
          auVar81._16_4_ = 0x39506967;
          auVar81._20_4_ = 0x39506967;
          auVar81._24_4_ = 0x39506967;
          auVar81._28_4_ = 0x39506967;
          auVar82._8_4_ = 0x3ab743ce;
          auVar82._0_8_ = 0x3ab743ce3ab743ce;
          auVar82._12_4_ = 0x3ab743ce;
          auVar82._16_4_ = 0x3ab743ce;
          auVar82._20_4_ = 0x3ab743ce;
          auVar82._24_4_ = 0x3ab743ce;
          auVar82._28_4_ = 0x3ab743ce;
          auVar83._8_4_ = 0x3c088908;
          auVar83._0_8_ = 0x3c0889083c088908;
          auVar83._12_4_ = 0x3c088908;
          auVar83._16_4_ = 0x3c088908;
          auVar83._20_4_ = 0x3c088908;
          auVar83._24_4_ = 0x3c088908;
          auVar83._28_4_ = 0x3c088908;
          auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar51 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          do {
            auVar16._4_4_ = local_158;
            auVar16._0_4_ = local_158;
            auVar16._8_4_ = local_158;
            auVar16._12_4_ = local_158;
            auVar16._16_4_ = local_158;
            auVar16._20_4_ = local_158;
            auVar16._24_4_ = local_158;
            auVar16._28_4_ = local_158;
            auVar52 = vfmadd213ps_avx512vl(*(undefined1 (*) [32])ppp_Var22,local_f8,auVar16);
            auVar56 = vmaxps_avx(auVar52,auVar75);
            auVar76 = vpsrld_avx2(auVar56,0x17);
            auVar53 = vpternlogd_avx512vl(auVar56,auVar55,auVar58,0xec);
            auVar56._8_4_ = 0x3f3504f3;
            auVar56._0_8_ = 0x3f3504f33f3504f3;
            auVar56._12_4_ = 0x3f3504f3;
            auVar56._16_4_ = 0x3f3504f3;
            auVar56._20_4_ = 0x3f3504f3;
            auVar56._24_4_ = 0x3f3504f3;
            auVar56._28_4_ = 0x3f3504f3;
            uVar23 = vcmpps_avx512vl(auVar53,auVar56,1);
            auVar54 = vmovdqa64_avx512vl(auVar55);
            auVar61._8_4_ = 0xbf800000;
            auVar61._0_8_ = 0xbf800000bf800000;
            auVar61._12_4_ = 0xbf800000;
            auVar61._16_4_ = 0xbf800000;
            auVar61._20_4_ = 0xbf800000;
            auVar61._24_4_ = 0xbf800000;
            auVar61._28_4_ = 0xbf800000;
            auVar55 = vaddps_avx512vl(auVar53,auVar61);
            auVar56 = vaddps_avx512vl(auVar55,auVar53);
            bVar8 = (bool)((byte)uVar23 & 1);
            auVar57._0_4_ = (float)((uint)bVar8 * auVar56._0_4_ | (uint)!bVar8 * auVar55._0_4_);
            bVar8 = (bool)((byte)(uVar23 >> 1) & 1);
            auVar57._4_4_ = (float)((uint)bVar8 * auVar56._4_4_ | (uint)!bVar8 * auVar55._4_4_);
            bVar8 = (bool)((byte)(uVar23 >> 2) & 1);
            auVar57._8_4_ = (float)((uint)bVar8 * auVar56._8_4_ | (uint)!bVar8 * auVar55._8_4_);
            bVar8 = (bool)((byte)(uVar23 >> 3) & 1);
            auVar57._12_4_ = (float)((uint)bVar8 * auVar56._12_4_ | (uint)!bVar8 * auVar55._12_4_);
            bVar8 = (bool)((byte)(uVar23 >> 4) & 1);
            auVar57._16_4_ = (float)((uint)bVar8 * auVar56._16_4_ | (uint)!bVar8 * auVar55._16_4_);
            bVar8 = (bool)((byte)(uVar23 >> 5) & 1);
            auVar57._20_4_ = (float)((uint)bVar8 * auVar56._20_4_ | (uint)!bVar8 * auVar55._20_4_);
            bVar8 = (bool)((byte)(uVar23 >> 6) & 1);
            auVar57._24_4_ = (float)((uint)bVar8 * auVar56._24_4_ | (uint)!bVar8 * auVar55._24_4_);
            bVar8 = SUB81(uVar23 >> 7,0);
            auVar57._28_4_ = (uint)bVar8 * auVar56._28_4_ | (uint)!bVar8 * auVar55._28_4_;
            auVar74._8_4_ = 0x3d9021bb;
            auVar74._0_8_ = 0x3d9021bb3d9021bb;
            auVar74._12_4_ = 0x3d9021bb;
            auVar74._16_4_ = 0x3d9021bb;
            auVar74._20_4_ = 0x3d9021bb;
            auVar74._24_4_ = 0x3d9021bb;
            auVar74._28_4_ = 0x3d9021bb;
            auVar53._8_4_ = 0xbdebd1b8;
            auVar53._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar53._12_4_ = 0xbdebd1b8;
            auVar53._16_4_ = 0xbdebd1b8;
            auVar53._20_4_ = 0xbdebd1b8;
            auVar53._24_4_ = 0xbdebd1b8;
            auVar53._28_4_ = 0xbdebd1b8;
            auVar55 = vfmadd213ps_avx512vl(auVar74,auVar57,auVar53);
            auVar11._8_4_ = 0x3def251a;
            auVar11._0_8_ = 0x3def251a3def251a;
            auVar11._12_4_ = 0x3def251a;
            auVar11._16_4_ = 0x3def251a;
            auVar11._20_4_ = 0x3def251a;
            auVar11._24_4_ = 0x3def251a;
            auVar11._28_4_ = 0x3def251a;
            auVar55 = vfmadd213ps_avx512vl(auVar55,auVar57,auVar11);
            auVar55 = vfmadd213ps_avx512vl(auVar55,auVar57,auVar41);
            auVar55 = vfmadd213ps_avx512vl(auVar55,auVar57,auVar42);
            auVar56 = vmovdqa64_avx512vl(auVar58);
            auVar17._4_4_ = auVar57._4_4_ * auVar57._4_4_;
            auVar17._0_4_ = auVar57._0_4_ * auVar57._0_4_;
            auVar17._8_4_ = auVar57._8_4_ * auVar57._8_4_;
            auVar17._12_4_ = auVar57._12_4_ * auVar57._12_4_;
            auVar17._16_4_ = auVar57._16_4_ * auVar57._16_4_;
            auVar17._20_4_ = auVar57._20_4_ * auVar57._20_4_;
            auVar17._24_4_ = auVar57._24_4_ * auVar57._24_4_;
            auVar17._28_4_ = auVar58._28_4_;
            auVar55 = vfmadd213ps_avx512vl(auVar55,auVar57,auVar43);
            auVar55 = vfmadd213ps_avx512vl(auVar55,auVar57,auVar44);
            auVar77 = vfmadd213ps_fma(auVar55,auVar57,auVar78);
            auVar55 = vfmadd213ps_avx512vl(ZEXT1632(auVar77),auVar57,auVar63);
            auVar58 = vmovdqa64_avx512vl(auVar59);
            auVar12._4_4_ = auVar57._4_4_ * auVar57._4_4_ * auVar57._4_4_ * auVar55._4_4_;
            auVar12._0_4_ = auVar57._0_4_ * auVar57._0_4_ * auVar57._0_4_ * auVar55._0_4_;
            auVar12._8_4_ = auVar57._8_4_ * auVar57._8_4_ * auVar57._8_4_ * auVar55._8_4_;
            auVar12._12_4_ = auVar57._12_4_ * auVar57._12_4_ * auVar57._12_4_ * auVar55._12_4_;
            auVar12._16_4_ = auVar57._16_4_ * auVar57._16_4_ * auVar57._16_4_ * auVar55._16_4_;
            auVar12._20_4_ = auVar57._20_4_ * auVar57._20_4_ * auVar57._20_4_ * auVar55._20_4_;
            auVar12._24_4_ = auVar57._24_4_ * auVar57._24_4_ * auVar57._24_4_ * auVar55._24_4_;
            auVar12._28_4_ = auVar55._28_4_;
            auVar59 = vmovdqa64_avx512vl(auVar58);
            auVar55 = vpaddd_avx2(auVar76,auVar59);
            auVar55 = vcvtdq2ps_avx(auVar55);
            auVar58 = vsubps_avx512vl(auVar55,auVar71);
            bVar8 = (bool)((byte)uVar23 & 1);
            auVar60._0_4_ = (uint)bVar8 * auVar58._0_4_ | (uint)!bVar8 * auVar55._0_4_;
            bVar8 = (bool)((byte)(uVar23 >> 1) & 1);
            auVar60._4_4_ = (uint)bVar8 * auVar58._4_4_ | (uint)!bVar8 * auVar55._4_4_;
            bVar8 = (bool)((byte)(uVar23 >> 2) & 1);
            auVar60._8_4_ = (uint)bVar8 * auVar58._8_4_ | (uint)!bVar8 * auVar55._8_4_;
            bVar8 = (bool)((byte)(uVar23 >> 3) & 1);
            auVar60._12_4_ = (uint)bVar8 * auVar58._12_4_ | (uint)!bVar8 * auVar55._12_4_;
            bVar8 = (bool)((byte)(uVar23 >> 4) & 1);
            auVar60._16_4_ = (uint)bVar8 * auVar58._16_4_ | (uint)!bVar8 * auVar55._16_4_;
            bVar8 = (bool)((byte)(uVar23 >> 5) & 1);
            auVar60._20_4_ = (uint)bVar8 * auVar58._20_4_ | (uint)!bVar8 * auVar55._20_4_;
            bVar8 = (bool)((byte)(uVar23 >> 6) & 1);
            auVar60._24_4_ = (uint)bVar8 * auVar58._24_4_ | (uint)!bVar8 * auVar55._24_4_;
            bVar8 = SUB81(uVar23 >> 7,0);
            auVar60._28_4_ = (uint)bVar8 * auVar58._28_4_ | (uint)!bVar8 * auVar55._28_4_;
            auVar77 = vfmadd231ps_fma(auVar12,auVar60,auVar45);
            auVar55 = vfmsub231ps_avx512vl(ZEXT1632(auVar77),auVar46,auVar17);
            auVar58 = vmovdqa64_avx512vl(auVar56);
            uVar23 = vcmpps_avx512vl(auVar52,ZEXT832(0) << 0x20,2);
            auVar55 = vsubps_avx(auVar55,auVar57);
            auVar56 = vfmsub231ps_avx512vl(auVar55,auVar47,auVar60);
            auVar55 = vpcmpeqd_avx2(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20);
            bVar8 = (bool)((byte)uVar23 & 1);
            bVar1 = (bool)((byte)(uVar23 >> 1) & 1);
            bVar2 = (bool)((byte)(uVar23 >> 2) & 1);
            bVar3 = (bool)((byte)(uVar23 >> 3) & 1);
            bVar4 = (bool)((byte)(uVar23 >> 4) & 1);
            bVar5 = (bool)((byte)(uVar23 >> 5) & 1);
            bVar6 = (bool)((byte)(uVar23 >> 6) & 1);
            bVar7 = SUB81(uVar23 >> 7,0);
            auVar52._4_4_ =
                 (float)((uint)bVar1 * auVar55._4_4_ | (uint)!bVar1 * auVar56._4_4_) * local_d8;
            auVar52._0_4_ =
                 (float)((uint)bVar8 * auVar55._0_4_ | (uint)!bVar8 * auVar56._0_4_) * local_d8;
            auVar52._8_4_ =
                 (float)((uint)bVar2 * auVar55._8_4_ | (uint)!bVar2 * auVar56._8_4_) * local_d8;
            auVar52._12_4_ =
                 (float)((uint)bVar3 * auVar55._12_4_ | (uint)!bVar3 * auVar56._12_4_) * local_d8;
            auVar52._16_4_ =
                 (float)((uint)bVar4 * auVar55._16_4_ | (uint)!bVar4 * auVar56._16_4_) * local_d8;
            auVar52._20_4_ =
                 (float)((uint)bVar5 * auVar55._20_4_ | (uint)!bVar5 * auVar56._20_4_) * local_d8;
            auVar52._24_4_ =
                 (float)((uint)bVar6 * auVar55._24_4_ | (uint)!bVar6 * auVar56._24_4_) * local_d8;
            auVar52._28_4_ = (uint)bVar7 * auVar55._28_4_ | (uint)!bVar7 * auVar56._28_4_;
            auVar55 = vminps_avx512vl(auVar52,auVar48);
            auVar55 = vmaxps_avx(auVar79,auVar55);
            auVar77 = vfmadd231ps_fma(auVar46,auVar55,auVar80);
            auVar56 = vroundps_avx(ZEXT1632(auVar77),1);
            uVar23 = vcmpps_avx512vl(ZEXT1632(auVar77),auVar56,1);
            auVar61 = vsubps_avx512vl(auVar56,auVar71);
            bVar8 = (bool)((byte)uVar23 & 1);
            auVar62._0_4_ = (float)((uint)bVar8 * auVar61._0_4_ | (uint)!bVar8 * auVar56._0_4_);
            bVar8 = (bool)((byte)(uVar23 >> 1) & 1);
            auVar62._4_4_ = (float)((uint)bVar8 * auVar61._4_4_ | (uint)!bVar8 * auVar56._4_4_);
            bVar8 = (bool)((byte)(uVar23 >> 2) & 1);
            auVar62._8_4_ = (float)((uint)bVar8 * auVar61._8_4_ | (uint)!bVar8 * auVar56._8_4_);
            bVar8 = (bool)((byte)(uVar23 >> 3) & 1);
            auVar62._12_4_ = (float)((uint)bVar8 * auVar61._12_4_ | (uint)!bVar8 * auVar56._12_4_);
            bVar8 = (bool)((byte)(uVar23 >> 4) & 1);
            auVar62._16_4_ = (float)((uint)bVar8 * auVar61._16_4_ | (uint)!bVar8 * auVar56._16_4_);
            bVar8 = (bool)((byte)(uVar23 >> 5) & 1);
            auVar62._20_4_ = (float)((uint)bVar8 * auVar61._20_4_ | (uint)!bVar8 * auVar56._20_4_);
            bVar8 = (bool)((byte)(uVar23 >> 6) & 1);
            auVar62._24_4_ = (float)((uint)bVar8 * auVar61._24_4_ | (uint)!bVar8 * auVar56._24_4_);
            bVar8 = SUB81(uVar23 >> 7,0);
            auVar62._28_4_ = (float)((uint)bVar8 * auVar61._28_4_ | (uint)!bVar8 * auVar56._28_4_);
            auVar55 = vfmsub231ps_avx512vl(auVar55,auVar62,auVar47);
            auVar55 = vfnmsub231ps_avx512vl(auVar55,auVar62,auVar45);
            auVar77 = vfmadd213ps_fma(auVar81,auVar55,auVar82);
            auVar76._4_4_ = auVar55._4_4_ * auVar55._4_4_;
            auVar76._0_4_ = auVar55._0_4_ * auVar55._0_4_;
            auVar76._8_4_ = auVar55._8_4_ * auVar55._8_4_;
            auVar76._12_4_ = auVar55._12_4_ * auVar55._12_4_;
            auVar76._16_4_ = auVar55._16_4_ * auVar55._16_4_;
            auVar76._20_4_ = auVar55._20_4_ * auVar55._20_4_;
            auVar76._24_4_ = auVar55._24_4_ * auVar55._24_4_;
            auVar76._28_4_ = auVar57._28_4_;
            auVar77 = vfmadd213ps_fma(ZEXT1632(auVar77),auVar55,auVar83);
            auVar56 = vfmadd213ps_avx512vl(ZEXT1632(auVar77),auVar55,auVar49);
            auVar56 = vfmadd213ps_avx512vl(auVar56,auVar55,auVar50);
            auVar56 = vfmadd213ps_avx512vl(auVar56,auVar55,auVar46);
            auVar77 = vfmadd213ps_fma(auVar56,auVar76,auVar55);
            auVar55 = vmovdqa64_avx512vl(auVar54);
            auVar73._0_4_ = (int)auVar62._0_4_;
            auVar73._4_4_ = (int)auVar62._4_4_;
            auVar73._8_4_ = (int)auVar62._8_4_;
            auVar73._12_4_ = (int)auVar62._12_4_;
            auVar73._16_4_ = (int)auVar62._16_4_;
            auVar73._20_4_ = (int)auVar62._20_4_;
            auVar73._24_4_ = (int)auVar62._24_4_;
            auVar73._28_4_ = (int)auVar62._28_4_;
            auVar56 = vpslld_avx2(auVar73,0x17);
            auVar56 = vpaddd_avx512vl(auVar56,auVar51);
            auVar54._4_4_ = auVar56._4_4_ * *(float *)((long)*pauVar38 + 4);
            auVar54._0_4_ = auVar56._0_4_ * *(float *)*pauVar38;
            auVar54._8_4_ = auVar56._8_4_ * *(float *)((long)*pauVar38 + 8);
            auVar54._12_4_ = auVar56._12_4_ * *(float *)((long)*pauVar38 + 0xc);
            auVar54._16_4_ = auVar56._16_4_ * *(float *)((long)*pauVar38 + 0x10);
            auVar54._20_4_ = auVar56._20_4_ * *(float *)((long)*pauVar38 + 0x14);
            auVar54._24_4_ = auVar56._24_4_ * *(float *)((long)*pauVar38 + 0x18);
            auVar54._28_4_ = auVar56._28_4_;
            auVar77 = vfmadd213ps_fma(auVar54,ZEXT1632(auVar77),auVar54);
            *pauVar38 = ZEXT1632(auVar77);
            ppp_Var22 = ppp_Var22 + 4;
            pauVar38 = pauVar38 + 1;
            iVar30 = iVar30 + 8;
            uVar24 = uVar35;
            fStack_154 = local_158;
            fStack_150 = local_158;
            fStack_14c = local_158;
            fStack_148 = local_158;
            fStack_144 = local_158;
            fStack_140 = local_158;
            fStack_13c = local_158;
            fStack_d4 = local_d8;
            fStack_d0 = local_d8;
            fStack_cc = local_d8;
            fStack_c8 = local_d8;
            fStack_c4 = local_d8;
            fStack_c0 = local_d8;
            fStack_bc = local_d8;
          } while (iVar30 < (int)uVar28);
        }
        if (uVar28 - uVar24 != 0 && (int)uVar24 <= (int)uVar28) {
          lVar33 = 0;
          do {
            auVar77 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)ppp_Var22 + lVar33 * 4)),
                                      auVar64._0_16_,ZEXT416((uint)(pLVar34->super_LRN).bias));
            fVar69 = powf(auVar77._0_4_,-(pLVar34->super_LRN).beta);
            auVar64 = ZEXT1664(local_b8._0_16_);
            *(float *)((long)*pauVar38 + lVar33 * 4) =
                 fVar69 * *(float *)((long)*pauVar38 + lVar33 * 4);
            lVar33 = lVar33 + 1;
            pLVar34 = local_210;
          } while (uVar28 - uVar24 != (int)lVar33);
        }
        uVar21 = uVar21 + 1;
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        uVar23 = local_1b0;
        uVar35 = (uint)local_218;
      } while (uVar21 != local_1b0);
    }
    piVar15 = (int *)CONCAT44(fStack_1fc,local_208._8_4_);
    iVar30 = 0;
    if (piVar15 == (int *)0x0) goto LAB_003163aa;
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 != 0) goto LAB_003163aa;
    if (local_1e8 != (Allocator *)0x0) {
      (*local_1e8->_vptr_Allocator[3])();
      goto LAB_003163aa;
    }
  }
  else {
    if (iVar19 != 1) goto LAB_003163aa;
    piVar15 = (int *)CONCAT44(local_1a8._12_4_,local_1a8._8_4_);
    local_208._0_8_ = local_1a8._0_8_;
    local_208._8_4_ = local_1a8._8_4_;
    fStack_1fc = (float)local_1a8._12_4_;
    local_1f8 = (undefined4)local_198;
    uStack_1f4 = (undefined4)(local_198 >> 0x20);
    local_1f0 = local_190;
    local_1e8 = local_188;
    iStack_1e0 = iStack_180;
    fStack_1dc = fStack_17c;
    iStack_1d8 = (int)sStack_178;
    iStack_1d4 = (int)(sStack_178 >> 0x20);
    iStack_1d0 = local_170;
    local_1c8 = local_168;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + 1;
      UNLOCK();
    }
    uVar28 = (local_210->super_LRN).local_size;
    fVar69 = local_158;
    if (1 < (int)uVar28) {
      uVar24 = uVar28 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border((Mat *)local_1a8,(Mat *)local_208,uVar24,~uVar24 + uVar28,uVar24,
                       ~uVar24 + uVar28,0,0.0,(Option *)&_space_ofs);
      if (((Allocator *)local_208._0_8_ == (Allocator *)0x0) || ((long)iStack_1d0 * local_1c8 == 0))
      {
        piVar15 = (int *)CONCAT44(fStack_1fc,local_208._8_4_);
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            if (local_1e8 == (Allocator *)0x0) goto joined_r0x00316382;
            (*local_1e8->_vptr_Allocator[3])();
          }
        }
        goto LAB_003163a5;
      }
      uVar28 = (local_210->super_LRN).local_size;
      fVar69 = fStack_1dc;
    }
    pLVar34 = local_210;
    local_b8._0_8_ = CONCAT44(0,uVar28 * uVar28);
    local_d8 = (local_210->super_LRN).alpha;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,local_b8._0_8_,&local_219);
    piVar18 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar30 = (pLVar34->super_LRN).local_size;
    if (0 < iVar30) {
      iVar29 = (int)fVar69 - iVar30;
      iVar19 = 0;
      iVar20 = 0;
      iVar25 = 0;
      do {
        if (0 < iVar30) {
          lVar33 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar25 + lVar33] = iVar20 + (int)lVar33;
            iVar30 = (pLVar34->super_LRN).local_size;
            lVar33 = lVar33 + 1;
            iVar32 = (int)lVar33;
          } while (iVar32 < iVar30);
          iVar25 = iVar25 + iVar32;
          iVar20 = iVar20 + iVar32;
        }
        iVar20 = iVar20 + iVar29;
        iVar19 = iVar19 + 1;
      } while (iVar19 < iVar30);
    }
    if (0 < (int)uVar35) {
      local_100 = (long)(int)local_158;
      iVar30 = local_b8._0_4_;
      local_118 = bottom_top_blob->data;
      local_120 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      local_128 = (Allocator *)local_208._0_8_;
      local_130 = local_1c8 * CONCAT44(uStack_1f4,local_1f8);
      local_110 = (long)(int)fStack_1dc * CONCAT44(uStack_1f4,local_1f8);
      auVar64 = vpbroadcastq_avx512f();
      local_1b8 = (Mat *)CONCAT44(local_1b8._4_4_,1.0 / (float)iVar30);
      local_1c0 = 0;
      auVar65 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar66 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      local_b8 = vmovdqu64_avx512f(auVar64);
      do {
        if (0 < (int)(uint)local_218) {
          local_108 = (_func_int ***)((long)&local_128->_vptr_Allocator + local_130 * local_1c0);
          pvVar36 = (void *)(local_120 * local_1c0 + (long)local_118);
          auVar44._24_8_ = 0;
          auVar44._0_24_ = local_f8._8_24_;
          local_f8 = auVar44 << 0x40;
          do {
            ppp_Var22 = local_108;
            if (0 < (int)local_158) {
              lVar37 = local_110 * local_f8._0_8_;
              lVar33 = 0;
              do {
                if (uVar28 == 0) {
                  fVar69 = 0.0;
                }
                else {
                  uVar23 = 0;
                  auVar67 = ZEXT1664(ZEXT816(0) << 0x40);
                  do {
                    auVar72 = auVar67;
                    auVar67 = vpbroadcastq_avx512f();
                    auVar68 = vporq_avx512f(auVar67,auVar65);
                    auVar67 = vporq_avx512f(auVar67,auVar66);
                    uVar9 = vpcmpuq_avx512f(auVar67,auVar64,2);
                    bVar13 = (byte)uVar9;
                    uVar9 = vpcmpuq_avx512f(auVar68,auVar64,2);
                    bVar14 = (byte)uVar9;
                    uVar39 = CONCAT11(bVar14,bVar13);
                    vmovdqu32_avx512f(*(undefined1 (*) [64])(piVar18 + uVar23));
                    auVar67 = vgatherdps_avx512f(*(undefined4 *)
                                                  ((long)ppp_Var22 +
                                                  uVar23 * 4 + lVar33 * 4 + lVar37));
                    auVar68._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar67._4_4_;
                    auVar68._0_4_ = (uint)(bVar13 & 1) * auVar67._0_4_;
                    auVar68._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar67._8_4_;
                    auVar68._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar67._12_4_;
                    auVar68._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar67._16_4_;
                    auVar68._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar67._20_4_;
                    auVar68._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar67._24_4_;
                    auVar68._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar67._28_4_;
                    auVar68._32_4_ = (uint)(bVar14 & 1) * auVar67._32_4_;
                    auVar68._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar67._36_4_;
                    auVar68._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar67._40_4_;
                    auVar68._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar67._44_4_;
                    auVar68._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar67._48_4_;
                    auVar68._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar67._52_4_;
                    auVar68._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar67._56_4_;
                    auVar68._60_4_ = (uint)(bVar14 >> 7) * auVar67._60_4_;
                    auVar67 = vaddps_avx512f(auVar68,auVar72);
                    uVar23 = uVar23 + 0x10;
                  } while ((iVar30 + (uint)(iVar30 == 0) + 0xf & 0xfffffff0) != uVar23);
                  auVar64._0_4_ =
                       (uint)(bVar13 & 1) * auVar67._0_4_ |
                       (uint)!(bool)(bVar13 & 1) * auVar72._0_4_;
                  bVar8 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar64._4_4_ = (uint)bVar8 * auVar67._4_4_ | (uint)!bVar8 * auVar72._4_4_;
                  bVar8 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar64._8_4_ = (uint)bVar8 * auVar67._8_4_ | (uint)!bVar8 * auVar72._8_4_;
                  bVar8 = (bool)((byte)(uVar39 >> 3) & 1);
                  auVar64._12_4_ = (uint)bVar8 * auVar67._12_4_ | (uint)!bVar8 * auVar72._12_4_;
                  bVar8 = (bool)((byte)(uVar39 >> 4) & 1);
                  auVar64._16_4_ = (uint)bVar8 * auVar67._16_4_ | (uint)!bVar8 * auVar72._16_4_;
                  bVar8 = (bool)((byte)(uVar39 >> 5) & 1);
                  auVar64._20_4_ = (uint)bVar8 * auVar67._20_4_ | (uint)!bVar8 * auVar72._20_4_;
                  bVar8 = (bool)((byte)(uVar39 >> 6) & 1);
                  auVar64._24_4_ = (uint)bVar8 * auVar67._24_4_ | (uint)!bVar8 * auVar72._24_4_;
                  bVar8 = (bool)((byte)(uVar39 >> 7) & 1);
                  auVar64._28_4_ = (uint)bVar8 * auVar67._28_4_ | (uint)!bVar8 * auVar72._28_4_;
                  auVar64._32_4_ =
                       (uint)(bVar14 & 1) * auVar67._32_4_ |
                       (uint)!(bool)(bVar14 & 1) * auVar72._32_4_;
                  bVar8 = (bool)(bVar14 >> 1 & 1);
                  auVar64._36_4_ = (uint)bVar8 * auVar67._36_4_ | (uint)!bVar8 * auVar72._36_4_;
                  bVar8 = (bool)(bVar14 >> 2 & 1);
                  auVar64._40_4_ = (uint)bVar8 * auVar67._40_4_ | (uint)!bVar8 * auVar72._40_4_;
                  bVar8 = (bool)(bVar14 >> 3 & 1);
                  auVar64._44_4_ = (uint)bVar8 * auVar67._44_4_ | (uint)!bVar8 * auVar72._44_4_;
                  bVar8 = (bool)(bVar14 >> 4 & 1);
                  auVar64._48_4_ = (uint)bVar8 * auVar67._48_4_ | (uint)!bVar8 * auVar72._48_4_;
                  bVar8 = (bool)(bVar14 >> 5 & 1);
                  auVar64._52_4_ = (uint)bVar8 * auVar67._52_4_ | (uint)!bVar8 * auVar72._52_4_;
                  bVar8 = (bool)(bVar14 >> 6 & 1);
                  auVar64._56_4_ = (uint)bVar8 * auVar67._56_4_ | (uint)!bVar8 * auVar72._56_4_;
                  auVar64._60_4_ =
                       (uint)(bVar14 >> 7) * auVar67._60_4_ |
                       (uint)!(bool)(bVar14 >> 7) * auVar72._60_4_;
                  auVar63 = vextractf64x4_avx512f(auVar64,1);
                  auVar64 = vaddps_avx512f(auVar64,ZEXT3264(auVar63));
                  auVar40._0_4_ = auVar64._0_4_ + auVar64._16_4_;
                  auVar40._4_4_ = auVar64._4_4_ + auVar64._20_4_;
                  auVar40._8_4_ = auVar64._8_4_ + auVar64._24_4_;
                  auVar40._12_4_ = auVar64._12_4_ + auVar64._28_4_;
                  auVar77 = vshufpd_avx(auVar40,auVar40,1);
                  auVar70._0_4_ = auVar40._0_4_ + auVar77._0_4_;
                  auVar70._4_4_ = auVar40._4_4_ + auVar77._4_4_;
                  auVar70._8_4_ = auVar40._8_4_ + auVar77._8_4_;
                  auVar70._12_4_ = auVar40._12_4_ + auVar77._12_4_;
                  auVar77 = vhaddps_avx(auVar70,auVar70);
                  fVar69 = auVar77._0_4_;
                }
                auVar77 = vfmadd213ss_fma(ZEXT416((uint)(fVar69 * local_d8)),
                                          ZEXT416((uint)local_1b8),
                                          ZEXT416((uint)(pLVar34->super_LRN).bias));
                auVar10._8_4_ = 0x80000000;
                auVar10._0_8_ = 0x8000000080000000;
                auVar10._12_4_ = 0x80000000;
                auVar40 = vxorps_avx512vl(ZEXT416((uint)(pLVar34->super_LRN).beta),auVar10);
                fVar69 = powf(auVar77._0_4_,auVar40._0_4_);
                *(float *)((long)pvVar36 + lVar33 * 4) =
                     fVar69 * *(float *)((long)pvVar36 + lVar33 * 4);
                lVar33 = lVar33 + 1;
                auVar64 = vmovdqu64_avx512f(local_b8);
                auVar65 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                auVar66 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                pLVar34 = local_210;
              } while (lVar33 != CONCAT44(fStack_154,local_158));
            }
            pvVar36 = (void *)((long)pvVar36 + local_100 * 4);
            uVar23 = local_f8._0_8_ + 1;
            local_f8._0_8_ = uVar23;
          } while (uVar23 != local_218);
        }
        local_1c0 = local_1c0 + 1;
      } while (local_1c0 != local_1b0);
    }
    if (piVar18 != (pointer)0x0) {
      operator_delete(piVar18,(long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage - (long)piVar18);
    }
    piVar15 = (int *)CONCAT44(fStack_1fc,local_208._8_4_);
    iVar30 = 0;
    if (piVar15 == (int *)0x0) goto LAB_003163aa;
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 != 0) goto LAB_003163aa;
    if (local_1e8 != (Allocator *)0x0) {
      (*local_1e8->_vptr_Allocator[3])();
      goto LAB_003163aa;
    }
  }
  iVar30 = 0;
  if ((Allocator *)local_208._0_8_ != (Allocator *)0x0) {
    iVar30 = 0;
    free((void *)local_208._0_8_);
  }
LAB_003163aa:
  piVar15 = (int *)CONCAT44(local_1a8._12_4_,local_1a8._8_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if (local_188 == (Allocator *)0x0) {
        if ((Allocator *)local_1a8._0_8_ != (Allocator *)0x0) {
          free((void *)local_1a8._0_8_);
        }
      }
      else {
        (*local_188->_vptr_Allocator[3])();
      }
    }
  }
  return iVar30;
}

Assistant:

int LRN_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * powf(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}